

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

int WebRtcIsac_DecodeSpec
              (Bitstr *streamdata,int16_t AvgPitchGain_Q12,ISACBand band,double *fr,double *fi)

{
  int iVar1;
  ushort uVar2;
  int16_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int32_t num;
  long lVar9;
  int iVar10;
  ushort isSWB12kHz;
  bool bVar11;
  int32_t gain2_Q10;
  int16_t RCQ15 [6];
  int16_t ARCoefQ12 [7];
  int16_t data [480];
  uint16_t invARSpecQ8 [120];
  int32_t invARSpec2_Q16 [120];
  int16_t DitherQ7 [480];
  
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(DitherQ7,streamdata->W_upper,(int)AvgPitchGain_Q12,(int16_t)fr);
    isSWB12kHz = 0;
    iVar6 = 0x1e0;
  }
  else {
    GenerateDitherQ7LbUB(DitherQ7,streamdata->W_upper,band);
    isSWB12kHz = (ushort)(band == kIsacUpperBand12);
    iVar6 = 0x1e0;
    if (band == kIsacUpperBand12) {
      iVar6 = 0xf0;
    }
  }
  iVar4 = WebRtcIsac_DecodeRc(streamdata,RCQ15);
  iVar5 = -0x1a22;
  if (-1 < iVar4) {
    WebRtcSpl_ReflCoefToLpc(RCQ15,6,ARCoefQ12);
    iVar5 = WebRtcIsac_DecodeGain2(streamdata,&gain2_Q10);
    if (iVar5 < 0) {
      iVar5 = -0x1a22;
    }
    else {
      FindInvArSpec(ARCoefQ12,gain2_Q10,invARSpec2_Q16);
      uVar2 = WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]);
      iVar5 = 1 << ((byte)(uVar2 >> 1) & 0x1f);
      for (lVar9 = 0; lVar9 != 0x78; lVar9 = lVar9 + 1) {
        iVar4 = invARSpec2_Q16[lVar9];
        iVar1 = -iVar4;
        if (0 < iVar4) {
          iVar1 = iVar4;
        }
        iVar4 = iVar1 / iVar5 + iVar5 >> 1;
        iVar10 = -10;
        do {
          iVar5 = iVar4;
          iVar4 = iVar1 / iVar5 + iVar5 >> 1;
          if (iVar4 == iVar5) break;
          bVar11 = iVar10 != 0;
          iVar10 = iVar10 + 1;
        } while (bVar11);
        invARSpecQ8[lVar9] = (uint16_t)iVar4;
      }
      iVar6 = WebRtcIsac_DecLogisticMulti2(data,streamdata,invARSpecQ8,DitherQ7,iVar6,isSWB12kHz);
      iVar5 = -0x1a22;
      if (0 < iVar6) {
        iVar5 = iVar6;
        if (band == kIsacLowerBand) {
          num = 0x9000;
          if (AvgPitchGain_Q12 < 0x267) {
            num = 0x7800;
          }
          iVar6 = 0x288000;
          if (AvgPitchGain_Q12 < 0x267) {
            iVar6 = 0x218000;
          }
          for (uVar7 = 0; uVar7 < 0x1e0; uVar7 = uVar7 + 4) {
            iVar3 = WebRtcSpl_DivW32W16ResW16
                              (num,(int16_t)((uint)(*(int *)((long)invARSpec2_Q16 + uVar7) + iVar6)
                                            >> 0x10));
            iVar4 = (int)iVar3;
            *(double *)((long)fr + uVar7 * 4) =
                 (double)(data[uVar7] * iVar4 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fi + uVar7 * 4) =
                 (double)(data[uVar7 + 1] * iVar4 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fr + uVar7 * 4 + 8) =
                 (double)(data[uVar7 + 2] * iVar4 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 8) =
                 (double)(data[uVar7 + 3] * iVar4 + 0x200 >> 10) * 0.0078125;
          }
        }
        else if (band == kIsacUpperBand12) {
          for (uVar7 = 0; uVar7 < 0xf0; uVar7 = uVar7 + 4) {
            *(double *)((long)fr + uVar7 * 4) = (double)(int)data[uVar7] * 0.0078125;
            *(double *)((long)fi + uVar7 * 4) = (double)(int)data[uVar7 + 1] * 0.0078125;
            *(double *)((long)fr + uVar7 * 4 + 8) = (double)(int)data[uVar7 + 2] * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 8) = (double)(int)data[uVar7 + 3] * 0.0078125;
          }
          memset(fr + 0x78,0,0x3c0);
          memset(fi + 0x78,0,0x3c0);
        }
        else if (band == kIsacUpperBand16) {
          lVar9 = 0x778;
          for (lVar8 = 0; lVar8 != 0x3c0; lVar8 = lVar8 + 8) {
            *(double *)((long)fr + lVar8) = (double)(int)*(short *)((long)data + lVar8) * 0.0078125;
            *(double *)((long)fi + lVar8) =
                 (double)(int)*(short *)((long)data + lVar8 + 2) * 0.0078125;
            *(double *)((long)fr + lVar9) =
                 (double)(int)*(short *)((long)data + lVar8 + 4) * 0.0078125;
            *(double *)((long)fi + lVar9) =
                 (double)(int)*(short *)((long)data + lVar8 + 6) * 0.0078125;
            lVar9 = lVar9 + -8;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int WebRtcIsac_DecodeSpec(Bitstr* streamdata, int16_t AvgPitchGain_Q12,
                          enum ISACBand band, double* fr, double* fi) {
  int16_t  DitherQ7[FRAMESAMPLES];
  int16_t  data[FRAMESAMPLES];
  int32_t  invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int16_t  ARCoefQ12[AR_ORDER + 1];
  int16_t  RCQ15[AR_ORDER];
  int16_t  gainQ10;
  int32_t  gain2_Q10, res;
  int32_t  in_sqrt;
  int32_t  newRes;
  int k, len, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;
  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(DitherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(DitherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* Decode model parameters. */
  if (WebRtcIsac_DecodeRc(streamdata, RCQ15) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  if (WebRtcIsac_DecodeGain2(streamdata, &gain2_Q10) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);

  /* Convert to magnitude spectrum,
   * by doing square-roots (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;

    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0)
      in_sqrt = -in_sqrt;

    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }

  len = WebRtcIsac_DecLogisticMulti2(data, streamdata, invARSpecQ8, DitherQ7,
                                     num_dft_coeff, is_12khz);
  /* Arithmetic decoding of spectrum. */
  if (len < 1) {
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;
  }

  switch (band) {
    case kIsacLowerBand: {
      /* Scale down spectral samples with low SNR. */
      int32_t p1;
      int32_t p2;
      if (AvgPitchGain_Q12 <= 614) {
        p1 = 30 << 10;
        p2 = 32768 + (33 << 16);
      } else {
        p1 = 36 << 10;
        p2 = 32768 + (40 << 16);
      }
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        gainQ10 = WebRtcSpl_DivW32W16ResW16(p1, (int16_t)(
            (invARSpec2_Q16[k >> 2] + p2) >> 16));
        *fr++ = (double)((data[ k ] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 1] * gainQ10 + 512) >> 10) / 128.0;
        *fr++ = (double)((data[k + 2] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 3] * gainQ10 + 512) >> 10) / 128.0;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, i = 0; k < FRAMESAMPLES_HALF; k += 4) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        i++;
        fr[i] = (double)data[k + 2] / 128.0;
        fi[i] = (double)data[k + 3] / 128.0;
        i++;
      }
      /* The second half of real and imaginary coefficients is zero. This is
       * due to using the old FFT module which requires two signals as input
       * while in 0-12 kHz mode we only have 8-12 kHz band, and the second
       * signal is set to zero. */
      memset(&fr[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      memset(&fi[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      break;
    }
    case kIsacUpperBand16: {
      for (i = 0, k = 0; k < FRAMESAMPLES; k += 4, i++) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        fr[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 2] / 128.0;
        fi[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 3] / 128.0;
      }
      break;
    }
  }
  return len;
}